

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct>::erase
          (QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct> *this,ExtraStruct *b,qsizetype n)

{
  qsizetype *pqVar1;
  ExtraStruct *__src;
  ExtraStruct *pEVar2;
  long lVar3;
  QVariant *this_00;
  
  if (n != 0) {
    lVar3 = n * 0x28;
    this_00 = &b->value;
    do {
      ::QVariant::~QVariant(this_00);
      this_00 = (QVariant *)((long)(this_00 + 1) + 8);
      lVar3 = lVar3 + -0x28;
    } while (lVar3 != 0);
  }
  __src = b + n;
  pEVar2 = (this->super_QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct>).
           super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>.ptr;
  if ((pEVar2 == b) &&
     (__src != pEVar2 + (this->super_QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct>).
                        super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>.size)) {
    (this->super_QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct>).
    super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>.ptr = __src;
  }
  else if (__src != pEVar2 + (this->super_QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct>).
                             super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>.size) {
    memmove(b,__src,(long)(pEVar2 + (this->super_QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct>
                                    ).super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>.
                                    size) - (long)__src);
  }
  pqVar1 = &(this->super_QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct>).
            super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>.size;
  *pqVar1 = *pqVar1 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }